

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
slang::CommandLine::parseStr
          (CommandLine *this,string_view argList,ParseOptions options,bool *hasArg,string *current,
          SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *storage)

{
  string_view argList_00;
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  undefined4 in_ECX;
  char *pcVar4;
  char *in_RSI;
  char *in_RDI;
  CommandLine *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_retaddr;
  undefined8 in_stack_00000008;
  ParseOptions newOptions;
  string result;
  char c;
  const_pointer end;
  const_pointer ptr;
  anon_class_24_3_9a0900af pushArg;
  undefined8 in_stack_fffffffffffffef8;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  byte local_e2;
  byte local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined4 local_9c;
  __sv_type local_98;
  undefined4 local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char local_59;
  char *local_58;
  char *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined4 in_stack_ffffffffffffffe8;
  byte bVar6;
  undefined1 uVar7;
  byte bVar8;
  undefined1 uVar9;
  
  bVar6 = (byte)in_ECX;
  uVar7 = (undefined1)((uint)in_ECX >> 8);
  bVar8 = (byte)((uint)in_ECX >> 0x10);
  uVar9 = (undefined1)((uint)in_ECX >> 0x18);
  this_00 = in_R9;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  local_50 = pvVar2;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  local_58 = pvVar2 + sVar3;
  pcVar4 = local_50;
LAB_0059cd5d:
  while( true ) {
    local_50 = pcVar4;
    if (local_50 == local_58) {
      return;
    }
    local_59 = *local_50;
    local_50 = local_50 + 1;
    bVar1 = isWhitespace(local_59);
    if (!bVar1) break;
    parseStr::anon_class_24_3_9a0900af::operator()
              ((anon_class_24_3_9a0900af *)in_stack_ffffffffffffff00);
    pcVar4 = local_50;
  }
  if (((bVar6 & 1) != 0) && ((local_59 == '#' || (local_59 == '/')))) {
    if (local_59 == '#') {
      parseStr::anon_class_24_3_9a0900af::operator()
                ((anon_class_24_3_9a0900af *)in_stack_ffffffffffffff00);
      while( true ) {
        local_e1 = 0;
        if (local_50 != local_58) {
          bVar1 = isNewline(*local_50);
          local_e1 = bVar1 ^ 0xff;
        }
        pcVar4 = local_50;
        if ((local_e1 & 1) == 0) break;
        local_50 = local_50 + 1;
      }
      goto LAB_0059cd5d;
    }
    if ((((ulong)(in_R8->positional).
                 super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
         1) == 0) && (local_50 != local_58)) {
      if (*local_50 == '/') {
        parseStr::anon_class_24_3_9a0900af::operator()
                  ((anon_class_24_3_9a0900af *)in_stack_ffffffffffffff00);
        do {
          local_50 = local_50 + 1;
          local_e2 = 0;
          if (local_50 != local_58) {
            bVar1 = isNewline(*local_50);
            local_e2 = bVar1 ^ 0xff;
          }
          pcVar4 = local_50;
        } while ((local_e2 & 1) != 0);
      }
      else {
        if (*local_50 != '*') goto LAB_0059cfb2;
        parseStr::anon_class_24_3_9a0900af::operator()
                  ((anon_class_24_3_9a0900af *)in_stack_ffffffffffffff00);
        pcVar4 = local_50 + 1;
        do {
          local_50 = pcVar4;
          pcVar4 = local_50;
          if (local_50 == local_58) goto LAB_0059cd5d;
          pcVar4 = local_50 + 1;
        } while (((*local_50 != '*') || (pcVar4 == local_58)) || (*pcVar4 != '/'));
        pcVar4 = local_50 + 2;
      }
      goto LAB_0059cd5d;
    }
  }
LAB_0059cfb2:
  if (((local_59 == '$') && ((bVar8 & 1) != 0)) && (local_50 != local_58)) {
    in_stack_ffffffffffffff10 = &local_80;
    OS::parseEnvVar_abi_cxx11_
              ((char **)CONCAT17(uVar9,CONCAT16(bVar8,CONCAT15(uVar7,CONCAT14(bVar6,
                                                  in_stack_ffffffffffffffe8)))),in_RDI);
    local_84 = CONCAT13(uVar9,(uint3)CONCAT11(uVar7,bVar6));
    local_98 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff00);
    local_9c = local_84;
    argList_00._M_len._4_1_ = bVar6;
    argList_00._M_len._0_4_ = in_stack_ffffffffffffffe8;
    argList_00._M_len._5_1_ = uVar7;
    argList_00._M_len._6_1_ = bVar8;
    argList_00._M_len._7_1_ = uVar9;
    argList_00._M_str = in_RSI;
    in_stack_fffffffffffffef8 = in_stack_00000008;
    parseStr(in_R8,argList_00,SUB84((ulong)in_RDI >> 0x20,0),(bool *)this_00,in_R9,unaff_retaddr);
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    pcVar4 = local_50;
  }
  else {
    __c = (char)((ulong)in_stack_fffffffffffffef8 >> 0x38);
    if (local_59 == '\\') {
      pcVar4 = local_50;
      if (((local_50 != local_58) && (*local_50 != '\n')) && (*local_50 != '\r')) {
        local_50 = local_50 + 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_ffffffffffffff00,__c);
        *(undefined1 *)
         &(in_R8->positional).
          super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
        pcVar4 = local_50;
      }
    }
    else {
      *(undefined1 *)
       &(in_R8->positional).
        super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      if (local_59 == '\'') {
        while (pcVar4 = local_50, local_50 != local_58) {
          local_59 = *local_50;
          pcVar4 = local_50 + 1;
          if (local_59 == '\'') break;
          local_50 = local_50 + 1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_ffffffffffffff00,(char)((ulong)in_stack_fffffffffffffef8 >> 0x38));
        }
      }
      else if (local_59 == '\"') {
        while (pcVar4 = local_50, local_50 != local_58) {
          pcVar4 = local_50 + 1;
          local_59 = *local_50;
          if (local_59 == '\"') break;
          if (((local_59 == '\\') && (pcVar4 != local_58)) &&
             ((*pcVar4 == '\\' || (*pcVar4 == '\"')))) {
            local_59 = *pcVar4;
            pcVar4 = local_50 + 2;
          }
          local_50 = pcVar4;
          if (((local_59 == '$') && ((bVar8 & 1) != 0)) && (local_50 != local_58)) {
            __str = &local_d0;
            pbVar5 = this_00;
            OS::parseEnvVar_abi_cxx11_
                      ((char **)CONCAT17(uVar9,CONCAT16(bVar8,CONCAT15(uVar7,CONCAT14(bVar6,
                                                  in_stack_ffffffffffffffe8)))),in_RDI);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (in_stack_ffffffffffffff10,__str);
            std::__cxx11::string::~string(this_00);
            in_stack_ffffffffffffff00 = this_00;
            this_00 = pbVar5;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(in_stack_ffffffffffffff00,(char)((ulong)in_stack_fffffffffffffef8 >> 0x38));
          }
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_ffffffffffffff00,__c);
        pcVar4 = local_50;
      }
    }
  }
  goto LAB_0059cd5d;
}

Assistant:

void CommandLine::parseStr(std::string_view argList, ParseOptions options, bool& hasArg,
                           std::string& current, SmallVectorBase<std::string>& storage) {
    auto pushArg = [&]() {
        if (hasArg) {
            storage.emplace_back(std::move(current));
            current.clear();
            hasArg = false;
        }
    };

    auto ptr = argList.data();
    auto end = ptr + argList.size();
    while (ptr != end) {
        // Whitespace breaks up arguments.
        char c = *ptr++;
        if (isWhitespace(c)) {
            pushArg();
            continue;
        }

        // Check for and consume comments.
        if (options.supportComments && (c == '#' || c == '/')) {
            // Slash character only applies if we aren't building an argument already.
            // The hash always applies, even if adjacent to an argument.
            if (c == '#') {
                pushArg();
                while (ptr != end && !isNewline(*ptr))
                    ptr++;
                continue;
            }

            if (!hasArg && ptr != end) {
                if (*ptr == '/') {
                    pushArg();
                    ptr++;
                    while (ptr != end && !isNewline(*ptr))
                        ptr++;
                    continue;
                }
                else if (*ptr == '*') {
                    pushArg();
                    ptr++;
                    while (ptr != end) {
                        c = *ptr++;
                        if (c == '*' && ptr != end && *ptr == '/') {
                            ptr++;
                            break;
                        }
                    }
                    continue;
                }
            }
        }

        // Look for environment variables to expand.
        if (c == '$' && options.expandEnvVars && ptr != end) {
            std::string result = OS::parseEnvVar(ptr, end);

            ParseOptions newOptions = options;
            newOptions.expandEnvVars = false;
            parseStr(result, newOptions, hasArg, current, storage);
            continue;
        }

        // Escape character preserves the value of the next character.
        if (c == '\\') {
            if (ptr != end && *ptr != '\n' && *ptr != '\r') {
                current += *ptr++;
                hasArg = true;
            }
            continue;
        }

        // Any non-whitespace character here means we are building an argument.
        hasArg = true;

        // Single quotes consume all characters until the next single quote.
        if (c == '\'') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '\'')
                    break;
                current += c;
            }
            continue;
        }

        // Double quotes consume all characters except escaped characters.
        if (c == '"') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '"')
                    break;

                // Only backslashes and quotes can be escaped.
                if (c == '\\' && ptr != end && (*ptr == '\\' || *ptr == '"'))
                    c = *ptr++;

                if (c == '$' && options.expandEnvVars && ptr != end)
                    current.append(OS::parseEnvVar(ptr, end));
                else
                    current += c;
            }
            continue;
        }

        // Otherwise we just have a normal character.
        current += c;
    }
}